

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O2

void __thiscall OPL3::~OPL3(OPL3 *this)

{
  Channel4op *(*papCVar1) [3];
  int array;
  long lVar2;
  int operatorNumber;
  long lVar3;
  Operator *(*papOVar4) [32];
  Channel2op *(*papCVar5) [9];
  
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPL3_006e9408;
  this->ryt = 0;
  setRhythmMode(this);
  papOVar4 = this->operators;
  papCVar5 = this->channels2op;
  papCVar1 = this->channels4op;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      if ((*papOVar4)[lVar3] != (Operator *)0x0) {
        operator_delete((*papOVar4)[lVar3],0xb8);
      }
    }
    for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
      if ((*papCVar5)[lVar3] != (Channel2op *)0x0) {
        (*((*papCVar5)[lVar3]->super_Channel)._vptr_Channel[1])();
      }
    }
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if ((*papCVar1)[lVar3] != (Channel4op *)0x0) {
        (*((*papCVar1)[lVar3]->super_Channel)._vptr_Channel[1])();
      }
    }
    papOVar4 = papOVar4 + 1;
    papCVar5 = papCVar5 + 1;
    papCVar1 = papCVar1 + 1;
  }
  InstanceCount = InstanceCount + -1;
  if (InstanceCount == 0) {
    operator_delete(OPL3Data,0x547c0);
    OPL3Data = (OPL3DataStruct *)0x0;
    operator_delete(OperatorData,0x11c00);
    OperatorData = (OperatorDataStruct *)0x0;
  }
  return;
}

Assistant:

OPL3::~OPL3()
{
	ryt = 0;
	setRhythmMode();	// Make sure all operators point to the dynamically allocated ones.
	for (int array = 0; array < 2; array++)
	{
		for (int operatorNumber = 0; operatorNumber < 0x20; operatorNumber++)
		{
			if (operators[array][operatorNumber] != NULL)
			{
				delete operators[array][operatorNumber];
			}
		}
		for (int channelNumber = 0; channelNumber < 9; channelNumber++)
		{
			delete channels2op[array][channelNumber];
		}
		for (int channelNumber = 0; channelNumber < 3; channelNumber++)
		{
			delete channels4op[array][channelNumber];
		}
	}
	if (--InstanceCount == 0)
	{
		delete OPL3Data;
		OPL3Data = NULL;
		delete OperatorData;
		OperatorData = NULL;
	}
}